

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
setCountImpl<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Construct>
          (Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           *this,size_t count)

{
  ulong uVar1;
  FreeFunc *pFVar2;
  size_t sVar3;
  Hdr *pHVar4;
  Ret *pRVar5;
  HookCommonContext **ppHVar6;
  Ret *pRVar7;
  Hdr *pHVar8;
  Hdr *pHVar9;
  bool bVar10;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> hdr;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> local_38;
  
  pHVar9 = (this->
           super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           ).m_hdr;
  if ((pHVar9 != (Hdr *)0x0) && ((pHVar9->super_BufHdr).super_RefCount.m_refCount == 1)) {
    uVar1 = (this->
            super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
            ).m_count;
    if (uVar1 == count) {
      return true;
    }
    if (count * 0x10 <= (pHVar9->super_BufHdr).m_bufferSize) {
      if (uVar1 < count) {
        pRVar5 = (this->
                 super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                 ).m_p;
        for (pRVar7 = pRVar5 + uVar1; pRVar7 < pRVar5 + count; pRVar7 = pRVar7 + 1) {
          pRVar7->m_context = (HookCommonContext *)0x0;
          pRVar7->m_originalRet = 0;
        }
        pHVar9 = (this->
                 super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                 ).m_hdr;
      }
      pHVar9->m_count = count;
      (this->
      super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
      ).m_count = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
    release(&this->
             super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           );
  }
  else {
    if ((this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_count != 0) {
      sVar3 = getAllocSize<4096ul>(count * 0x10);
      pHVar4 = (Hdr *)mem::allocate(sVar3 + 0x30);
      (pHVar4->super_BufHdr).super_RefCount.m_refCount = 0;
      (pHVar4->super_BufHdr).super_RefCount.m_weakRefCount = 1;
      (pHVar4->super_BufHdr).m_bufferSize = sVar3;
      (pHVar4->super_BufHdr).m_flags = 0;
      (pHVar4->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Hdr_001990b8;
      (pHVar4->super_BufHdr).super_RefCount.m_freeFunc = mem::deallocate;
      rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::
      Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>(&local_38,pHVar4);
      bVar10 = local_38.m_p != (Hdr *)0x0;
      if (bVar10) {
        (local_38.m_p)->m_count = count;
        pHVar9 = local_38.m_p + 1;
        pRVar5 = (this->
                 super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                 ).m_p;
        uVar1 = (this->
                super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                ).m_count;
        if (uVar1 < count) {
          for (pHVar8 = pHVar9;
              pHVar8 < (Hdr *)(&(pHVar9->super_BufHdr).super_RefCount._vptr_RefCount + uVar1 * 2);
              pHVar8 = (Hdr *)&(pHVar8->super_BufHdr).super_RefCount.m_refCount) {
            pFVar2 = (FreeFunc *)pRVar5->m_originalRet;
            (pHVar8->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)pRVar5->m_context;
            (pHVar8->super_BufHdr).super_RefCount.m_freeFunc = pFVar2;
            pRVar5 = pRVar5 + 1;
          }
          for (ppHVar6 = (HookCommonContext **)
                         (&(pHVar9->super_BufHdr).super_RefCount._vptr_RefCount +
                         (this->
                         super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                         ).m_count * 2);
              ppHVar6 < &(pHVar9->super_BufHdr).super_RefCount._vptr_RefCount + count * 2;
              ppHVar6 = ppHVar6 + 2) {
            *ppHVar6 = (HookCommonContext *)0x0;
            ppHVar6[1] = (HookCommonContext *)0x0;
          }
        }
        else {
          for (pHVar8 = pHVar9;
              pHVar8 < (Hdr *)(&(pHVar9->super_BufHdr).super_RefCount._vptr_RefCount + count * 2);
              pHVar8 = (Hdr *)&(pHVar8->super_BufHdr).super_RefCount.m_refCount) {
            pFVar2 = (FreeFunc *)pRVar5->m_originalRet;
            (pHVar8->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)pRVar5->m_context;
            (pHVar8->super_BufHdr).super_RefCount.m_freeFunc = pFVar2;
            pRVar5 = pRVar5 + 1;
          }
        }
        rc::RefCount::release
                  ((RefCount *)
                   (this->
                   super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                   ).m_hdr);
        pHVar4 = local_38.m_p;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_p = (Ret *)pHVar9;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_hdr = pHVar4;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_count = count;
      }
      rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::~Ptr(&local_38);
      return bVar10;
    }
    bVar10 = reserve(this,count);
    if (!bVar10) {
      return false;
    }
    pRVar5 = (this->
             super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
             ).m_p;
    pRVar7 = pRVar5 + count;
    for (; pRVar5 < pRVar7; pRVar5 = pRVar5 + 1) {
      pRVar5->m_context = (HookCommonContext *)0x0;
      pRVar5->m_originalRet = 0;
    }
    ((this->
     super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>)
    .m_hdr)->m_count = count;
    (this->
    super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>).
    m_count = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}